

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O3

void Wln_WriteTables(FILE *pFile,Wln_Ntk_t *p)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  void *__s;
  ulong uVar7;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar8;
  int iVar9;
  ulong uVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  long lVar13;
  undefined8 *puVar14;
  int iVar15;
  long lVar16;
  
  pVVar11 = p->vTables;
  if (pVVar11 != (Vec_Ptr_t *)0x0) {
    uVar6 = pVVar11->nSize;
    lVar16 = (long)(int)uVar6;
    if (lVar16 != 0) {
      uVar5 = 0x10;
      if (0x10 < uVar6) {
        uVar5 = uVar6;
      }
      __s = malloc((long)(int)uVar5 << 2);
      if (__s != (void *)0x0) {
        memset(__s,0,lVar16 * 4);
      }
      uVar7 = (ulong)(p->vTypes).nSize;
      if (1 < (long)uVar7) {
        piVar1 = (p->vTypes).pArray;
        uVar10 = 1;
        lVar13 = 0x18;
        do {
          if (piVar1[uVar10] == 0x4d) {
            puVar14 = (undefined8 *)((long)&p->vFanins->nCap + lVar13);
            if (2 < *(int *)((long)p->vFanins + lVar13 + -4)) {
              puVar14 = (undefined8 *)*puVar14;
            }
            iVar9 = *(int *)((long)puVar14 + 4);
            if (((long)iVar9 < 0) || ((int)uVar6 <= iVar9)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)__s + (long)iVar9 * 4) = (int)uVar10;
          }
          uVar10 = uVar10 + 1;
          lVar13 = lVar13 + 0x10;
        } while (uVar10 < uVar7);
      }
      if ((int)uVar6 < 1) {
        if (__s == (void *)0x0) {
          return;
        }
      }
      else {
        lVar13 = 0;
        do {
          if (lVar16 == lVar13) {
LAB_00366d7c:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar6 = *(uint *)((long)__s + lVar13 * 4);
          paVar8 = &p->vFanins[(int)uVar6].field_2;
          if (2 < p->vFanins[(int)uVar6].nSize) {
            paVar8 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar8->pArray[0];
          }
          iVar9 = paVar8->Array[0];
          if (((long)iVar9 < 0) || (uVar5 = (p->vRanges).nSize, (int)uVar5 <= iVar9))
          goto LAB_00366d7c;
          piVar1 = (p->vRanges).pArray;
          iVar9 = piVar1[iVar9];
          if (iVar9 < 0) {
LAB_00366d9b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          pVVar2 = p->pRanges->vObjs;
          uVar12 = iVar9 * 4;
          iVar9 = pVVar2->nSize;
          if (iVar9 <= (int)uVar12) goto LAB_00366d9b;
          piVar3 = pVVar2->pArray;
          iVar15 = piVar3[uVar12] - piVar3[(ulong)uVar12 + 1];
          iVar4 = -iVar15;
          if (0 < iVar15) {
            iVar4 = iVar15;
          }
          if (((int)uVar6 < 0) || (uVar5 <= uVar6)) goto LAB_00366d7c;
          iVar15 = piVar1[(int)uVar6];
          if ((iVar15 < 0) || (uVar6 = iVar15 * 4, iVar9 <= (int)uVar6)) goto LAB_00366d9b;
          iVar15 = piVar3[uVar6] - piVar3[(ulong)uVar6 + 1];
          iVar9 = -iVar15;
          if (0 < iVar15) {
            iVar9 = iVar15;
          }
          Wln_WriteTableOne(pFile,iVar4 + 1,iVar9 + 1,(word *)pVVar11->pArray[lVar13],(int)lVar13);
          lVar13 = lVar13 + 1;
          pVVar11 = p->vTables;
        } while (lVar13 < pVVar11->nSize);
      }
      free(__s);
      return;
    }
  }
  return;
}

Assistant:

void Wln_WriteTables( FILE * pFile, Wln_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    word * pTable; 
    int i, iObj;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wln_NtkForEachObj( p, iObj )
        if ( Wln_ObjType(p, iObj) == ABC_OPER_TABLE )
            Vec_IntWriteEntry( vNodes, Wln_ObjFanin1(p, iObj), iObj );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        int iNode  = Vec_IntEntry( vNodes, i );
        int iFanin = Wln_ObjFanin0( p, iNode );
        Wln_WriteTableOne( pFile, Wln_ObjRange(p, iFanin), Wln_ObjRange(p, iNode), pTable, i );
    }
    Vec_IntFree( vNodes );
}